

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O1

cram_block_compression_hdr * cram_decode_compression_header(cram_fd *fd,cram_block *b)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  khint_t kVar6;
  cram_block_compression_hdr *h;
  long lVar7;
  int32_t *piVar8;
  kh_map_t *pkVar9;
  cram_map *pcVar10;
  cram_codec *pcVar11;
  uint uVar12;
  cram_map **__s;
  long lVar13;
  char *key;
  cram_encoding cVar14;
  cram_map **cp;
  cram_map **ppcVar15;
  uint uVar16;
  byte *pbVar17;
  byte *pbVar18;
  bool bVar19;
  int r;
  int local_54;
  byte *local_50;
  byte *local_48;
  cram_map **local_40;
  cram_block *local_38;
  
  h = (cram_block_compression_hdr *)calloc(1,0x418);
  if (h == (cram_block_compression_hdr *)0x0) {
    return (cram_block_compression_hdr *)0x0;
  }
  if ((b->method == RAW) || (iVar4 = cram_uncompress_block(b), iVar4 == 0)) {
    pbVar17 = b->data;
    if ((fd->version & 0xffffff00U) == 0x100) {
      bVar1 = *pbVar17;
      uVar12 = (uint)bVar1;
      lVar7 = 1;
      if ((char)bVar1 < '\0') {
        uVar5 = (uint)bVar1;
        uVar12 = (uint)pbVar17[1];
        if (bVar1 < 0xc0) {
          uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
          lVar13 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)pbVar17[2];
          lVar13 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 | (uint)pbVar17[2] << 8 | (uint)pbVar17[3]
          ;
          lVar13 = 4;
        }
        else {
          uVar12 = pbVar17[4] & 0xf |
                   (uint)pbVar17[3] << 4 | (uint)pbVar17[2] << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
          lVar13 = 5;
        }
      }
      else {
        lVar13 = 1;
      }
      h->ref_seq_id = uVar12;
      bVar1 = pbVar17[lVar13];
      uVar12 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar5 = (uint)bVar1;
        uVar12 = (uint)pbVar17[lVar13 + 1];
        if (bVar1 < 0xc0) {
          uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
          lVar7 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)pbVar17[lVar13 + 2];
          lVar7 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 | (uint)pbVar17[lVar13 + 2] << 8 |
                   (uint)pbVar17[lVar13 + 3];
          lVar7 = 4;
        }
        else {
          uVar12 = pbVar17[lVar13 + 4] & 0xf |
                   (uint)pbVar17[lVar13 + 3] << 4 |
                   (uint)pbVar17[lVar13 + 2] << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
          lVar7 = 5;
        }
      }
      h->ref_seq_start = uVar12;
      lVar2 = lVar7 + lVar13;
      bVar1 = pbVar17[lVar7 + lVar13];
      uVar12 = (uint)bVar1;
      lVar7 = 1;
      if ((char)bVar1 < '\0') {
        uVar5 = (uint)bVar1;
        uVar12 = (uint)pbVar17[lVar2 + 1];
        if (bVar1 < 0xc0) {
          uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
          lVar13 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)pbVar17[lVar2 + 2];
          lVar13 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 | (uint)pbVar17[lVar2 + 2] << 8 |
                   (uint)pbVar17[lVar2 + 3];
          lVar13 = 4;
        }
        else {
          uVar12 = pbVar17[lVar2 + 4] & 0xf |
                   (uint)pbVar17[lVar2 + 3] << 4 |
                   (uint)pbVar17[lVar2 + 2] << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
          lVar13 = 5;
        }
      }
      else {
        lVar13 = 1;
      }
      h->ref_seq_span = uVar12;
      lVar3 = lVar13 + lVar2;
      bVar1 = pbVar17[lVar13 + lVar2];
      uVar12 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar5 = (uint)bVar1;
        uVar12 = (uint)pbVar17[lVar3 + 1];
        if (bVar1 < 0xc0) {
          uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
          lVar7 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)pbVar17[lVar3 + 2];
          lVar7 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 | (uint)pbVar17[lVar3 + 2] << 8 |
                   (uint)pbVar17[lVar3 + 3];
          lVar7 = 4;
        }
        else {
          uVar12 = pbVar17[lVar3 + 4] & 0xf |
                   (uint)pbVar17[lVar3 + 3] << 4 |
                   (uint)pbVar17[lVar3 + 2] << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
          lVar7 = 5;
        }
      }
      h->num_records = uVar12;
      lVar13 = lVar7 + lVar3;
      bVar1 = pbVar17[lVar7 + lVar3];
      uVar12 = (uint)bVar1;
      lVar7 = 1;
      if ((char)bVar1 < '\0') {
        uVar5 = (uint)bVar1;
        uVar12 = (uint)pbVar17[lVar13 + 1];
        if (bVar1 < 0xc0) {
          uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
          lVar7 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)pbVar17[lVar13 + 2];
          lVar7 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 | (uint)pbVar17[lVar13 + 2] << 8 |
                   (uint)pbVar17[lVar13 + 3];
          lVar7 = 4;
        }
        else {
          uVar12 = pbVar17[lVar13 + 4] & 0xf |
                   (uint)pbVar17[lVar13 + 3] << 4 |
                   (uint)pbVar17[lVar13 + 2] << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
          lVar7 = 5;
        }
      }
      h->num_landmarks = uVar12;
      piVar8 = (int32_t *)malloc((long)(int)uVar12 << 2);
      h->landmark = piVar8;
      if (piVar8 == (int32_t *)0x0) goto LAB_0011a948;
      pbVar17 = pbVar17 + lVar7 + lVar13;
      iVar4 = h->num_landmarks;
      if (0 < (long)iVar4) {
        lVar7 = 0;
        do {
          bVar1 = *pbVar17;
          uVar12 = (uint)bVar1;
          lVar13 = 1;
          if ((char)bVar1 < '\0') {
            uVar5 = (uint)bVar1;
            uVar12 = (uint)pbVar17[1];
            if (bVar1 < 0xc0) {
              uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
              lVar13 = 2;
            }
            else if (bVar1 < 0xe0) {
              uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)pbVar17[2];
              lVar13 = 3;
            }
            else if (bVar1 < 0xf0) {
              uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 | (uint)pbVar17[2] << 8 |
                       (uint)pbVar17[3];
              lVar13 = 4;
            }
            else {
              uVar12 = pbVar17[4] & 0xf |
                       (uint)pbVar17[3] << 4 |
                       (uint)pbVar17[2] << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
              lVar13 = 5;
            }
          }
          piVar8[lVar7] = uVar12;
          pbVar17 = pbVar17 + lVar13;
          lVar7 = lVar7 + 1;
        } while (iVar4 != lVar7);
      }
    }
    lVar7 = 1;
    pkVar9 = (kh_map_t *)calloc(1,0x28);
    h->preservation_map = pkVar9;
    __s = h->rec_encoding_map;
    local_40 = __s;
    memset(__s,0,0x200);
    if (pkVar9 != (kh_map_t *)0x0) {
      h->mapped_qs_included = 0;
      h->unmapped_qs_included = 0;
      h->unmapped_placed = 0;
      h->qs_included = 0;
      h->read_names_included = 0;
      h->AP_delta = 1;
      *(char *)((long)(h->substitution_matrix + 0) + 0) = 'C';
      *(char *)((long)(h->substitution_matrix + 0) + 1) = 'G';
      *(char *)((long)(h->substitution_matrix + 0) + 2) = 'T';
      *(char *)((long)(h->substitution_matrix + 0) + 3) = 'N';
      *(char *)((long)(h->substitution_matrix + 1) + 0) = 'A';
      *(char *)((long)(h->substitution_matrix + 1) + 1) = 'G';
      *(char *)((long)(h->substitution_matrix + 1) + 2) = 'T';
      *(char *)((long)(h->substitution_matrix + 1) + 3) = 'N';
      *(char *)((long)(h->substitution_matrix + 2) + 0) = 'A';
      *(char *)((long)(h->substitution_matrix + 2) + 1) = 'C';
      *(char *)((long)(h->substitution_matrix + 2) + 2) = 'T';
      *(char *)((long)(h->substitution_matrix + 2) + 3) = 'N';
      *(char *)((long)(h->substitution_matrix + 3) + 0) = 'A';
      *(char *)((long)(h->substitution_matrix + 3) + 1) = 'C';
      *(char *)((long)(h->substitution_matrix + 3) + 2) = 'G';
      *(char *)((long)(h->substitution_matrix + 3) + 3) = 'N';
      h->substitution_matrix[4] = (char  [4])0x54474341;
      bVar1 = *pbVar17;
      uVar12 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar5 = (uint)pbVar17[1];
        if (bVar1 < 0xc0) {
          local_50 = (byte *)CONCAT44(local_50._4_4_,(uVar12 & 0x3f) << 8 | uVar5);
          lVar7 = 2;
        }
        else if (bVar1 < 0xe0) {
          local_50 = (byte *)CONCAT44(local_50._4_4_,
                                      (uVar12 & 0x1f) << 0x10 | uVar5 << 8 | (uint)pbVar17[2]);
          lVar7 = 3;
        }
        else if (bVar1 < 0xf0) {
          local_50 = (byte *)CONCAT44(local_50._4_4_,
                                      (uVar12 & 0xf) << 0x18 | uVar5 << 0x10 | (uint)pbVar17[2] << 8
                                      | (uint)pbVar17[3]);
          lVar7 = 4;
        }
        else {
          local_50 = (byte *)CONCAT44(local_50._4_4_,
                                      pbVar17[4] & 0xf |
                                      (uint)pbVar17[3] << 4 |
                                      (uint)pbVar17[2] << 0xc | uVar5 << 0x14 | uVar12 << 0x1c);
          lVar7 = 5;
        }
      }
      else {
        local_50 = (byte *)CONCAT44(local_50._4_4_,uVar12);
      }
      local_48 = pbVar17 + lVar7;
      bVar1 = pbVar17[lVar7];
      uVar12 = (uint)bVar1;
      lVar7 = 1;
      if ((char)bVar1 < '\0') {
        uVar5 = (uint)bVar1;
        uVar12 = (uint)local_48[1];
        if (bVar1 < 0xc0) {
          uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
          lVar7 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)local_48[2];
          lVar7 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 | (uint)local_48[2] << 8 |
                   (uint)local_48[3];
          lVar7 = 4;
        }
        else {
          uVar12 = local_48[4] & 0xf |
                   (uint)local_48[3] << 4 |
                   (uint)local_48[2] << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
          lVar7 = 5;
        }
      }
      cp = (cram_map **)(local_48 + lVar7);
      local_38 = b;
      if (0 < (int)uVar12) {
        ppcVar15 = cp;
        do {
          uVar5 = (int)(char)*(byte *)ppcVar15 << 8 | (int)(char)*(byte *)((long)ppcVar15 + 1);
          if ((int)uVar5 < 0x5252) {
            if ((int)uVar5 < 0x5049) {
              if (uVar5 == 0x4150) {
                bVar1 = *(byte *)((long)ppcVar15 + 2);
                __s = (cram_map **)
                      ((ulong)__s & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU);
                kVar6 = kh_put_map(h->preservation_map,"AP",&local_54);
                if (local_54 == -1) {
LAB_0011aeee:
                  cram_free_compression_header(h);
                  bVar19 = false;
                  cp = (cram_map **)((long)ppcVar15 + 3);
                  goto LAB_0011af48;
                }
                h->preservation_map->vals[kVar6].p = (char *)__s;
                h->AP_delta = (int)(char)bVar1;
              }
              else if (uVar5 == 0x4d49) {
                bVar1 = *(byte *)((long)ppcVar15 + 2);
                __s = (cram_map **)
                      ((ulong)__s & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU);
                kVar6 = kh_put_map(h->preservation_map,"MI",&local_54);
                if (local_54 == -1) goto LAB_0011aeee;
                h->preservation_map->vals[kVar6].p = (char *)__s;
                h->mapped_qs_included = (int)(char)bVar1;
              }
              else {
LAB_0011af6a:
                fprintf(_stderr,"Unrecognised preservation map key %c%c\n");
              }
            }
            else if (uVar5 == 0x5049) {
              bVar1 = *(byte *)((long)ppcVar15 + 2);
              __s = (cram_map **)((ulong)__s & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU)
              ;
              kVar6 = kh_put_map(h->preservation_map,"PI",&local_54);
              if (local_54 == -1) goto LAB_0011aeee;
              h->preservation_map->vals[kVar6].p = (char *)__s;
              h->unmapped_placed = (int)(char)bVar1;
            }
            else {
              if (uVar5 != 0x524e) goto LAB_0011af6a;
              bVar1 = *(byte *)((long)ppcVar15 + 2);
              __s = (cram_map **)((ulong)__s & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU)
              ;
              kVar6 = kh_put_map(h->preservation_map,"RN",&local_54);
              if (local_54 == -1) goto LAB_0011aeee;
              h->preservation_map->vals[kVar6].p = (char *)__s;
              h->read_names_included = (int)(char)bVar1;
            }
LAB_0011aeea:
            bVar19 = true;
            cp = (cram_map **)((long)ppcVar15 + 3);
          }
          else {
            cp = (cram_map **)((long)ppcVar15 + 2);
            if ((int)uVar5 < 0x5444) {
              if (uVar5 == 0x5252) {
                bVar1 = *(byte *)((long)ppcVar15 + 2);
                __s = (cram_map **)
                      ((ulong)__s & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU);
                kVar6 = kh_put_map(h->preservation_map,"RR",&local_54);
                if (local_54 == -1) goto LAB_0011aeee;
                h->preservation_map->vals[kVar6].p = (char *)__s;
                fd->no_ref = (uint)(bVar1 == 0);
                goto LAB_0011aeea;
              }
              if (uVar5 != 0x534d) goto LAB_0011af6a;
              h->substitution_matrix[0][*(byte *)((long)ppcVar15 + 2) >> 6] = 'C';
              h->substitution_matrix[0][*(byte *)((long)ppcVar15 + 2) >> 4 & 3] = 'G';
              h->substitution_matrix[0][*(byte *)((long)ppcVar15 + 2) >> 2 & 3] = 'T';
              h->substitution_matrix[0][*(byte *)((long)ppcVar15 + 2) & 3] = 'N';
              h->substitution_matrix[1][*(byte *)((long)ppcVar15 + 3) >> 6] = 'A';
              h->substitution_matrix[1][*(byte *)((long)ppcVar15 + 3) >> 4 & 3] = 'G';
              h->substitution_matrix[1][*(byte *)((long)ppcVar15 + 3) >> 2 & 3] = 'T';
              h->substitution_matrix[1][*(byte *)((long)ppcVar15 + 3) & 3] = 'N';
              h->substitution_matrix[2][*(byte *)((long)ppcVar15 + 4) >> 6] = 'A';
              h->substitution_matrix[2][*(byte *)((long)ppcVar15 + 4) >> 4 & 3] = 'C';
              h->substitution_matrix[2][*(byte *)((long)ppcVar15 + 4) >> 2 & 3] = 'T';
              h->substitution_matrix[2][*(byte *)((long)ppcVar15 + 4) & 3] = 'N';
              h->substitution_matrix[3][*(byte *)((long)ppcVar15 + 5) >> 6] = 'A';
              h->substitution_matrix[3][*(byte *)((long)ppcVar15 + 5) >> 4 & 3] = 'C';
              h->substitution_matrix[3][*(byte *)((long)ppcVar15 + 5) >> 2 & 3] = 'G';
              h->substitution_matrix[3][*(byte *)((long)ppcVar15 + 5) & 3] = 'N';
              h->substitution_matrix[4][*(byte *)((long)ppcVar15 + 6) >> 6] = 'A';
              h->substitution_matrix[4][*(byte *)((long)ppcVar15 + 6) >> 4 & 3] = 'C';
              h->substitution_matrix[4][*(byte *)((long)ppcVar15 + 6) >> 2 & 3] = 'G';
              h->substitution_matrix[4][*(byte *)((long)ppcVar15 + 6) & 3] = 'T';
              ppcVar15 = (cram_map **)((long)ppcVar15 + 7);
              pkVar9 = h->preservation_map;
              key = "SM";
LAB_0011af1a:
              kVar6 = kh_put_map(pkVar9,key,&local_54);
              bVar19 = local_54 == -1;
              if (bVar19) {
                cram_free_compression_header(h);
              }
              else {
                h->preservation_map->vals[kVar6].p = (char *)cp;
              }
              bVar19 = !bVar19;
              __s = cp;
              cp = ppcVar15;
            }
            else {
              if (uVar5 != 0x5444) {
                if (uVar5 != 0x5549) goto LAB_0011af6a;
                bVar1 = *(byte *)((long)ppcVar15 + 2);
                __s = (cram_map **)
                      ((ulong)__s & 0xffffffff00000000 | (long)(char)bVar1 & 0xffffffffU);
                kVar6 = kh_put_map(h->preservation_map,"UI",&local_54);
                if (local_54 == -1) goto LAB_0011aeee;
                h->preservation_map->vals[kVar6].p = (char *)__s;
                h->unmapped_qs_included = (int)(char)bVar1;
                goto LAB_0011aeea;
              }
              uVar5 = cram_decode_TD((char *)cp,h);
              if (-1 < (int)uVar5) {
                ppcVar15 = (cram_map **)((ulong)uVar5 + (long)cp);
                pkVar9 = h->preservation_map;
                key = "TD";
                goto LAB_0011af1a;
              }
              cram_free_compression_header(h);
              bVar19 = false;
            }
          }
LAB_0011af48:
          if (!bVar19) {
            return (cram_block_compression_hdr *)0x0;
          }
          uVar12 = uVar12 - 1;
          ppcVar15 = cp;
        } while (uVar12 != 0);
      }
      if ((long)cp - (long)local_48 == (long)(int)local_50) {
        bVar1 = *(byte *)cp;
        lVar7 = 1;
        uVar12 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar5 = (uint)*(byte *)((long)cp + 1);
          if (bVar1 < 0xc0) {
            local_48 = (byte *)CONCAT44(local_48._4_4_,(uVar12 & 0x3f) << 8 | uVar5);
            lVar13 = 2;
          }
          else if (bVar1 < 0xe0) {
            local_48 = (byte *)CONCAT44(local_48._4_4_,
                                        (uVar12 & 0x1f) << 0x10 | uVar5 << 8 |
                                        (uint)*(byte *)((long)cp + 2));
            lVar13 = 3;
          }
          else if (bVar1 < 0xf0) {
            local_48 = (byte *)CONCAT44(local_48._4_4_,
                                        (uVar12 & 0xf) << 0x18 | uVar5 << 0x10 |
                                        (uint)*(byte *)((long)cp + 2) << 8 |
                                        (uint)*(byte *)((long)cp + 3));
            lVar13 = 4;
          }
          else {
            local_48 = (byte *)CONCAT44(local_48._4_4_,
                                        *(byte *)((long)cp + 4) & 0xf |
                                        (uint)*(byte *)((long)cp + 3) << 4 |
                                        (uint)*(byte *)((long)cp + 2) << 0xc |
                                        uVar5 << 0x14 | uVar12 << 0x1c);
            lVar13 = 5;
          }
        }
        else {
          local_48 = (byte *)CONCAT44(local_48._4_4_,uVar12);
          lVar13 = 1;
        }
        local_50 = (byte *)(lVar13 + (long)cp);
        bVar1 = *(byte *)((long)cp + lVar13);
        uVar12 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar5 = (uint)bVar1;
          uVar12 = (uint)local_50[1];
          if (bVar1 < 0xc0) {
            uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
            lVar7 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)local_50[2];
            lVar7 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 | (uint)local_50[2] << 8 |
                     (uint)local_50[3];
            lVar7 = 4;
          }
          else {
            uVar12 = local_50[4] & 0xf |
                     (uint)local_50[3] << 4 |
                     (uint)local_50[2] << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
            lVar7 = 5;
          }
        }
        pbVar17 = local_50 + lVar7;
        pbVar18 = pbVar17;
        if (0 < (int)uVar12) {
          do {
            pcVar10 = (cram_map *)malloc(0x20);
            if (pcVar10 == (cram_map *)0x0) {
              cram_free_compression_header(h);
              iVar4 = 1;
              pbVar17 = pbVar18;
            }
            else {
              bVar1 = pbVar18[2];
              cVar14 = (cram_encoding)bVar1;
              lVar7 = 1;
              if ((char)bVar1 < '\0') {
                uVar5 = (uint)bVar1;
                cVar14 = (cram_encoding)pbVar18[3];
                if (bVar1 < 0xc0) {
                  cVar14 = (uVar5 & 0x3f) << 8 | cVar14;
                  lVar13 = 2;
                }
                else if (bVar1 < 0xe0) {
                  cVar14 = (uVar5 & 0x1f) << 0x10 | cVar14 << 8 | (uint)pbVar18[4];
                  lVar13 = 3;
                }
                else if (bVar1 < 0xf0) {
                  cVar14 = (uVar5 & 0xf) << 0x18 | cVar14 << 0x10 | (uint)pbVar18[4] << 8 |
                           (uint)pbVar18[5];
                  lVar13 = 4;
                }
                else {
                  cVar14 = pbVar18[6] & (E_GOLOMB_RICE|E_SUBEXP) |
                           (uint)pbVar18[5] << 4 |
                           (uint)pbVar18[4] << 0xc | cVar14 << 0x14 | uVar5 << 0x1c;
                  lVar13 = 5;
                }
              }
              else {
                lVar13 = 1;
              }
              bVar1 = pbVar18[lVar13 + 2];
              uVar5 = (uint)bVar1;
              if ((char)bVar1 < '\0') {
                uVar16 = (uint)bVar1;
                uVar5 = (uint)pbVar18[lVar13 + 3];
                if (bVar1 < 0xc0) {
                  uVar5 = (uVar16 & 0x3f) << 8 | uVar5;
                  lVar7 = 2;
                }
                else if (bVar1 < 0xe0) {
                  uVar5 = (uVar16 & 0x1f) << 0x10 | uVar5 << 8 | (uint)pbVar18[lVar13 + 4];
                  lVar7 = 3;
                }
                else if (bVar1 < 0xf0) {
                  uVar5 = (uVar16 & 0xf) << 0x18 | uVar5 << 0x10 | (uint)pbVar18[lVar13 + 4] << 8 |
                          (uint)pbVar18[lVar13 + 5];
                  lVar7 = 4;
                }
                else {
                  uVar5 = pbVar18[lVar13 + 6] & 0xf |
                          (uint)pbVar18[lVar13 + 5] << 4 |
                          (uint)pbVar18[lVar13 + 4] << 0xc | uVar5 << 0x14 | uVar16 << 0x1c;
                  lVar7 = 5;
                }
              }
              pbVar17 = pbVar18 + lVar7 + lVar13 + 2;
              pcVar10->key = (int)(char)pbVar18[1] | (int)(char)*pbVar18 << 8;
              pcVar10->encoding = cVar14;
              pcVar10->size = uVar5;
              pcVar10->offset = (int)pbVar17 - *(int *)&local_38->data;
              pcVar10->codec = (cram_codec *)0x0;
              if (cVar14 == E_NULL) {
                iVar4 = 0xb;
              }
              else {
                bVar1 = *pbVar18;
                if ((bVar1 == 0x42) && (pbVar18[1] == 0x46)) {
                  pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                  h->codecs[0xf] = pcVar11;
LAB_0011b88f:
                  if (pcVar11 == (cram_codec *)0x0) {
                    cram_free_compression_header(h);
                    iVar4 = 1;
                    goto LAB_0011b8df;
                  }
                }
                else {
                  if ((bVar1 == 0x43) && (pbVar18[1] == 0x46)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x10] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if (bVar1 == 0x52) {
                    if (pbVar18[1] == 0x49) {
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                      h->codecs[0x21] = pcVar11;
                    }
                    else {
                      if (pbVar18[1] != 0x4c) goto LAB_0011b396;
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                      h->codecs[0x19] = pcVar11;
                    }
                    goto LAB_0011b88f;
                  }
LAB_0011b396:
                  if ((bVar1 == 0x41) && (pbVar18[1] == 0x50)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x11] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if ((bVar1 == 0x52) && (pbVar18[1] == 0x47)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x12] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if ((bVar1 == 0x4d) && (pbVar18[1] == 0x46)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x15] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if (bVar1 == 0x4e) {
                    if (pbVar18[1] == 0x53) {
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                      h->codecs[0x14] = pcVar11;
                    }
                    else {
                      if (pbVar18[1] != 0x50) goto LAB_0011b486;
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                      h->codecs[0x17] = pcVar11;
                    }
                    goto LAB_0011b88f;
                  }
LAB_0011b486:
                  if ((bVar1 == 0x54) && (pbVar18[1] == 0x53)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x16] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if ((bVar1 == 0x4e) && (pbVar18[1] == 0x46)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x18] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if (bVar1 == 0x54) {
                    if (pbVar18[1] == 0x43) {
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE,fd->version);
                      h->codecs[0x2c] = pcVar11;
                    }
                    else {
                      if (pbVar18[1] != 0x4e) goto LAB_0011b546;
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                      h->codecs[0x27] = pcVar11;
                    }
                    goto LAB_0011b88f;
                  }
LAB_0011b546:
                  if (bVar1 == 0x46) {
                    if (pbVar18[1] == 0x4e) {
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                      h->codecs[0x1a] = pcVar11;
                    }
                    else if (pbVar18[1] == 0x43) {
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE,fd->version);
                      h->codecs[0x1b] = pcVar11;
                    }
                    else {
                      if (pbVar18[1] != 0x50) goto LAB_0011b5da;
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                      h->codecs[0x1c] = pcVar11;
                    }
                    goto LAB_0011b88f;
                  }
LAB_0011b5da:
                  if ((bVar1 == 0x42) && (pbVar18[1] == 0x53)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE,fd->version);
                    h->codecs[0x1f] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if (bVar1 == 0x44) {
                    if (pbVar18[1] != 0x4c) goto LAB_0011b6ad;
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x1d] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if (bVar1 == 0x53) {
                    if (pbVar18[1] != 0x43) goto LAB_0011b6ad;
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE_ARRAY,
                                                fd->version);
                    h->codecs[0xe] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if ((bVar1 == 0x49) && (pbVar18[1] == 0x4e)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE_ARRAY,
                                                fd->version);
                    h->codecs[0xd] = pcVar11;
                    goto LAB_0011b88f;
                  }
LAB_0011b6ad:
                  if (bVar1 == 0x42) {
                    if (pbVar18[1] == 0x41) {
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE,fd->version);
                      h->codecs[0x1e] = pcVar11;
                    }
                    else {
                      if (pbVar18[1] != 0x42) goto LAB_0011b70d;
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE_ARRAY,
                                                  fd->version);
                      h->codecs[0x25] = pcVar11;
                    }
                    goto LAB_0011b88f;
                  }
LAB_0011b70d:
                  if ((bVar1 == 0x52) && (pbVar18[1] == 0x53)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x22] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if (bVar1 == 0x48) {
                    if (pbVar18[1] != 0x43) goto LAB_0011b7a2;
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x24] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if ((bVar1 == 0x50) && (pbVar18[1] == 0x44)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x23] = pcVar11;
                    goto LAB_0011b88f;
                  }
LAB_0011b7a2:
                  if ((bVar1 == 0x4d) && (pbVar18[1] == 0x51)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                    h->codecs[0x13] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if ((bVar1 == 0x52) && (pbVar18[1] == 0x4e)) {
                    pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE_ARRAY_BLOCK,
                                                fd->version);
                    h->codecs[0xb] = pcVar11;
                    goto LAB_0011b88f;
                  }
                  if (bVar1 == 0x51) {
                    if (pbVar18[1] == 0x53) {
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE,fd->version);
                      h->codecs[0xc] = pcVar11;
                    }
                    else {
                      if (pbVar18[1] != 0x51) goto LAB_0011b85c;
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_BYTE_ARRAY,
                                                  fd->version);
                      h->codecs[0x26] = pcVar11;
                    }
                    goto LAB_0011b88f;
                  }
LAB_0011b85c:
                  if (bVar1 == 0x54) {
                    if (pbVar18[1] == 0x4c) {
                      pcVar11 = cram_decoder_init(cVar14,(char *)pbVar17,uVar5,E_INT,fd->version);
                      h->codecs[0x20] = pcVar11;
                      goto LAB_0011b88f;
                    }
                    if ((pbVar18[1] != 0x4d) && (pbVar18[1] != 0x56)) goto LAB_0011b90d;
                  }
                  else {
LAB_0011b90d:
                    fprintf(_stderr,"Unrecognised key: %.2s\n",pbVar18);
                  }
                }
                pbVar17 = pbVar17 + (int)uVar5;
                pcVar10->next =
                     local_40[(uint)pbVar18[1] + (uint)*pbVar18 + (uint)*pbVar18 * 2 & 0x1f];
                local_40[(uint)pbVar18[1] + (uint)*pbVar18 + (uint)*pbVar18 * 2 & 0x1f] = pcVar10;
                iVar4 = 0;
              }
            }
LAB_0011b8df:
            if ((iVar4 != 0xb) && (iVar4 != 0)) {
              return (cram_block_compression_hdr *)0x0;
            }
            uVar12 = uVar12 - 1;
            pbVar18 = pbVar17;
          } while (uVar12 != 0);
        }
        if ((long)pbVar17 - (long)local_50 == (long)(int)local_48) {
          bVar1 = *pbVar17;
          lVar7 = 1;
          uVar12 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            uVar5 = (uint)pbVar17[1];
            if (bVar1 < 0xc0) {
              local_50 = (byte *)CONCAT44(local_50._4_4_,(uVar12 & 0x3f) << 8 | uVar5);
              lVar13 = 2;
            }
            else if (bVar1 < 0xe0) {
              local_50 = (byte *)CONCAT44(local_50._4_4_,
                                          (uVar12 & 0x1f) << 0x10 | uVar5 << 8 | (uint)pbVar17[2]);
              lVar13 = 3;
            }
            else if (bVar1 < 0xf0) {
              local_50 = (byte *)CONCAT44(local_50._4_4_,
                                          (uVar12 & 0xf) << 0x18 | uVar5 << 0x10 |
                                          (uint)pbVar17[2] << 8 | (uint)pbVar17[3]);
              lVar13 = 4;
            }
            else {
              local_50 = (byte *)CONCAT44(local_50._4_4_,
                                          pbVar17[4] & 0xf |
                                          (uint)pbVar17[3] << 4 |
                                          (uint)pbVar17[2] << 0xc | uVar5 << 0x14 | uVar12 << 0x1c);
              lVar13 = 5;
            }
          }
          else {
            local_50 = (byte *)CONCAT44(local_50._4_4_,uVar12);
            lVar13 = 1;
          }
          local_40 = (cram_map **)(pbVar17 + lVar13);
          bVar1 = pbVar17[lVar13];
          uVar12 = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            uVar5 = (uint)bVar1;
            uVar12 = (uint)*(byte *)((long)local_40 + 1);
            if (bVar1 < 0xc0) {
              uVar12 = (uVar5 & 0x3f) << 8 | uVar12;
              lVar7 = 2;
            }
            else if (bVar1 < 0xe0) {
              uVar12 = (uVar5 & 0x1f) << 0x10 | uVar12 << 8 | (uint)*(byte *)((long)local_40 + 2);
              lVar7 = 3;
            }
            else if (bVar1 < 0xf0) {
              uVar12 = (uVar5 & 0xf) << 0x18 | uVar12 << 0x10 |
                       (uint)*(byte *)((long)local_40 + 2) << 8 |
                       (uint)*(byte *)((long)local_40 + 3);
              lVar7 = 4;
            }
            else {
              uVar12 = *(byte *)((long)local_40 + 4) & 0xf |
                       (uint)*(byte *)((long)local_40 + 3) << 4 |
                       (uint)*(byte *)((long)local_40 + 2) << 0xc | uVar12 << 0x14 | uVar5 << 0x1c;
              lVar7 = 5;
            }
          }
          pbVar17 = (byte *)(lVar7 + (long)local_40);
          if (0 < (int)uVar12) {
            do {
              pcVar10 = (cram_map *)malloc(0x20);
              if (pcVar10 == (cram_map *)0x0) {
                cram_free_compression_header(h);
                bVar19 = false;
              }
              else {
                pcVar10->key = (int)(char)pbVar17[3] |
                               (int)(char)pbVar17[2] << 8 | (int)(char)pbVar17[1] << 0x10;
                bVar1 = pbVar17[4];
                cVar14 = (cram_encoding)bVar1;
                lVar7 = 1;
                if ((char)bVar1 < '\0') {
                  uVar5 = (uint)bVar1;
                  cVar14 = (cram_encoding)pbVar17[5];
                  if (bVar1 < 0xc0) {
                    cVar14 = (uVar5 & 0x3f) << 8 | cVar14;
                    lVar13 = 2;
                  }
                  else if (bVar1 < 0xe0) {
                    cVar14 = (uVar5 & 0x1f) << 0x10 | cVar14 << 8 | (uint)pbVar17[6];
                    lVar13 = 3;
                  }
                  else if (bVar1 < 0xf0) {
                    cVar14 = (uVar5 & 0xf) << 0x18 | cVar14 << 0x10 | (uint)pbVar17[6] << 8 |
                             (uint)pbVar17[7];
                    lVar13 = 4;
                  }
                  else {
                    cVar14 = pbVar17[8] & (E_GOLOMB_RICE|E_SUBEXP) |
                             (uint)pbVar17[7] << 4 |
                             (uint)pbVar17[6] << 0xc | cVar14 << 0x14 | uVar5 << 0x1c;
                    lVar13 = 5;
                  }
                }
                else {
                  lVar13 = 1;
                }
                bVar1 = pbVar17[lVar13 + 4];
                uVar5 = (uint)bVar1;
                if ((char)bVar1 < '\0') {
                  uVar16 = (uint)bVar1;
                  uVar5 = (uint)pbVar17[lVar13 + 5];
                  if (bVar1 < 0xc0) {
                    uVar5 = (uVar16 & 0x3f) << 8 | uVar5;
                    lVar7 = 2;
                  }
                  else if (bVar1 < 0xe0) {
                    uVar5 = (uVar16 & 0x1f) << 0x10 | uVar5 << 8 | (uint)pbVar17[lVar13 + 6];
                    lVar7 = 3;
                  }
                  else if (bVar1 < 0xf0) {
                    uVar5 = (uVar16 & 0xf) << 0x18 | uVar5 << 0x10 | (uint)pbVar17[lVar13 + 6] << 8
                            | (uint)pbVar17[lVar13 + 7];
                    lVar7 = 4;
                  }
                  else {
                    uVar5 = pbVar17[lVar13 + 8] & 0xf |
                            (uint)pbVar17[lVar13 + 7] << 4 |
                            (uint)pbVar17[lVar13 + 6] << 0xc | uVar5 << 0x14 | uVar16 << 0x1c;
                    lVar7 = 5;
                  }
                }
                pbVar18 = pbVar17 + lVar7 + lVar13 + 4;
                pcVar10->encoding = cVar14;
                pcVar10->size = uVar5;
                pcVar10->offset = (int)pbVar18 - *(int *)&local_38->data;
                pcVar11 = cram_decoder_init(cVar14,(char *)pbVar18,uVar5,E_BYTE_ARRAY_BLOCK,
                                            fd->version);
                pcVar10->codec = pcVar11;
                if (pcVar11 == (cram_codec *)0x0) {
                  cram_free_compression_header(h);
                  free(pcVar10);
                  pbVar17 = pbVar18;
                }
                else {
                  pcVar10->next =
                       h->tag_encoding_map
                       [(uint)pbVar17[2] + (uint)pbVar17[1] + (uint)pbVar17[1] * 2 & 0x1f];
                  h->tag_encoding_map
                  [(uint)pbVar17[2] + (uint)pbVar17[1] + (uint)pbVar17[1] * 2 & 0x1f] = pcVar10;
                  pbVar17 = pbVar18 + (int)uVar5;
                }
                bVar19 = pcVar11 != (cram_codec *)0x0;
              }
              if (!bVar19) {
                return (cram_block_compression_hdr *)0x0;
              }
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          if ((long)pbVar17 - (long)local_40 == (long)(int)local_50) {
            return h;
          }
        }
      }
    }
    cram_free_compression_header(h);
  }
  else {
LAB_0011a948:
    free(h);
  }
  return (cram_block_compression_hdr *)0x0;
}

Assistant:

cram_block_compression_hdr *cram_decode_compression_header(cram_fd *fd,
							   cram_block *b) {
    char *cp, *cp_copy;
    cram_block_compression_hdr *hdr = calloc(1, sizeof(*hdr));
    int i;
    int32_t map_size, map_count;

    if (!hdr)
	return NULL;

    if (b->method != RAW) {
	if (cram_uncompress_block(b)) {
	    free(hdr);
	    return NULL;
	}
    }

    cp = (char *)b->data;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	cp += itf8_get(cp, &hdr->ref_seq_id);
	cp += itf8_get(cp, &hdr->ref_seq_start);
	cp += itf8_get(cp, &hdr->ref_seq_span);
	cp += itf8_get(cp, &hdr->num_records);
	cp += itf8_get(cp, &hdr->num_landmarks);
	if (!(hdr->landmark = malloc(hdr->num_landmarks * sizeof(int32_t)))) {
	    free(hdr);
	    return NULL;
	}
	for (i = 0; i < hdr->num_landmarks; i++) {
	    cp += itf8_get(cp, &hdr->landmark[i]);
	}
    }

    hdr->preservation_map = kh_init(map);

    memset(hdr->rec_encoding_map, 0,
	   CRAM_MAP_HASH * sizeof(hdr->rec_encoding_map[0]));
    memset(hdr->tag_encoding_map, 0,
	   CRAM_MAP_HASH * sizeof(hdr->tag_encoding_map[0]));

    if (!hdr->preservation_map) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Initialise defaults for preservation map */
    hdr->mapped_qs_included = 0;
    hdr->unmapped_qs_included = 0;
    hdr->unmapped_placed = 0;
    hdr->qs_included = 0;
    hdr->read_names_included = 0;
    hdr->AP_delta = 1;
    memcpy(hdr->substitution_matrix, "CGTNAGTNACTNACGNACGT", 20);

    /* Preservation map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	pmap_t hd;
	khint_t k;
	int r;

	cp += 2;
	switch(CRAM_KEY(cp[-2],cp[-1])) {
	case CRAM_KEY('M','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "MI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->mapped_qs_included = hd.i;
	    break;

	case CRAM_KEY('U','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "UI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->unmapped_qs_included = hd.i;
	    break;

	case CRAM_KEY('P','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "PI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->unmapped_placed = hd.i;
	    break;

	case CRAM_KEY('R','N'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "RN", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->read_names_included = hd.i;
	    break;

	case CRAM_KEY('A','P'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "AP", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->AP_delta = hd.i;
	    break;

	case CRAM_KEY('R','R'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "RR", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    fd->no_ref = !hd.i;
	    break;

	case CRAM_KEY('S','M'):
	    hdr->substitution_matrix[0][(cp[0]>>6)&3] = 'C';
	    hdr->substitution_matrix[0][(cp[0]>>4)&3] = 'G';
	    hdr->substitution_matrix[0][(cp[0]>>2)&3] = 'T';
	    hdr->substitution_matrix[0][(cp[0]>>0)&3] = 'N';

	    hdr->substitution_matrix[1][(cp[1]>>6)&3] = 'A';
	    hdr->substitution_matrix[1][(cp[1]>>4)&3] = 'G';
	    hdr->substitution_matrix[1][(cp[1]>>2)&3] = 'T';
	    hdr->substitution_matrix[1][(cp[1]>>0)&3] = 'N';

	    hdr->substitution_matrix[2][(cp[2]>>6)&3] = 'A';
	    hdr->substitution_matrix[2][(cp[2]>>4)&3] = 'C';
	    hdr->substitution_matrix[2][(cp[2]>>2)&3] = 'T';
	    hdr->substitution_matrix[2][(cp[2]>>0)&3] = 'N';

	    hdr->substitution_matrix[3][(cp[3]>>6)&3] = 'A';
	    hdr->substitution_matrix[3][(cp[3]>>4)&3] = 'C';
	    hdr->substitution_matrix[3][(cp[3]>>2)&3] = 'G';
	    hdr->substitution_matrix[3][(cp[3]>>0)&3] = 'N';

	    hdr->substitution_matrix[4][(cp[4]>>6)&3] = 'A';
	    hdr->substitution_matrix[4][(cp[4]>>4)&3] = 'C';
	    hdr->substitution_matrix[4][(cp[4]>>2)&3] = 'G';
	    hdr->substitution_matrix[4][(cp[4]>>0)&3] = 'T';

	    hd.p = cp;
	    cp += 5;

	    k = kh_put(map, hdr->preservation_map, "SM", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	    kh_val(hdr->preservation_map, k) = hd;
	    break;

	case CRAM_KEY('T','D'): {
	    int sz = cram_decode_TD(cp, hdr); // tag dictionary
	    if (sz < 0) {
		cram_free_compression_header(hdr);
		return NULL;
	    }

	    hd.p = cp;
	    cp += sz;

	    k = kh_put(map, hdr->preservation_map, "TD", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	    kh_val(hdr->preservation_map, k) = hd;
	    break;
	}

	default:
	    fprintf(stderr, "Unrecognised preservation map key %c%c\n",
		    cp[-2], cp[-1]);
	    // guess byte;
	    cp++;
	    break;
	}
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Record encoding map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	char *key = cp;
	int32_t encoding;
	int32_t size;
	cram_map *m = malloc(sizeof(*m)); // FIXME: use pooled_alloc

	if (!m) {
	    cram_free_compression_header(hdr);
	    return NULL;
	}

	cp += 2;
	cp += itf8_get(cp, &encoding);
	cp += itf8_get(cp, &size);

	// Fill out cram_map purely for cram_dump to dump out.
	m->key = (key[0]<<8)|key[1];
	m->encoding = encoding;
	m->size     = size;
	m->offset   = cp - (char *)b->data;
	m->codec = NULL;

	if (m->encoding == E_NULL)
	    continue;

	//printf("%s codes for %.2s\n", cram_encoding2str(encoding), key);

	/*
	 * For CRAM1.0 CF and BF are Byte and not Int.
	 * Practically speaking it makes no difference unless we have a
	 * 1.0 format file that stores these in EXTERNAL as only then
	 * does Byte vs Int matter.
	 *
	 * Neither this C code nor Java reference implementations did this,
	 * so we gloss over it and treat them as int.
	 */

	if (key[0] == 'B' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_BF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'C' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_CF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'I') {
	    if (!(hdr->codecs[DS_RI] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_RL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'A' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_AP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'G') {
	    if (!(hdr->codecs[DS_RG] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'M' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_MF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_NS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_NP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_TS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_NF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_TC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_TN] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_FN] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_FC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_FP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_BS] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'I' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_IN] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'S' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_SC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'D' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_DL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'A') {
	    if (!(hdr->codecs[DS_BA] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'B') {
	    if (!(hdr->codecs[DS_BB] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_RS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'P' && key[1] == 'D') {
	    if (!(hdr->codecs[DS_PD] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'H' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_HC] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'M' && key[1] == 'Q') {
	    if (!(hdr->codecs[DS_MQ] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_RN] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY_BLOCK,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'Q' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_QS] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'Q' && key[1] == 'Q') {
	    if (!(hdr->codecs[DS_QQ] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_TL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'M') {
	} else if (key[0] == 'T' && key[1] == 'V') {
	} else
	    fprintf(stderr, "Unrecognised key: %.2s\n", key);

	cp += size;

	m->next = hdr->rec_encoding_map[CRAM_MAP(key[0], key[1])];
	hdr->rec_encoding_map[CRAM_MAP(key[0], key[1])] = m;
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Tag encoding map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	int32_t encoding;
	int32_t size;
	cram_map *m = malloc(sizeof(*m)); // FIXME: use pooled_alloc
	char *key = cp+1;

	if (!m) {
	    cram_free_compression_header(hdr);
	    return NULL;
	}

	m->key = (key[0]<<16)|(key[1]<<8)|key[2];

	cp += 4; // Strictly ITF8, but this suffices
	cp += itf8_get(cp, &encoding);
	cp += itf8_get(cp, &size);

	m->encoding = encoding;
	m->size     = size;
	m->offset   = cp - (char *)b->data;
	if (!(m->codec = cram_decoder_init(encoding, cp, size,
					   E_BYTE_ARRAY_BLOCK, fd->version))) {
	    cram_free_compression_header(hdr);
	    free(m);
	    return NULL;
	}
	
	cp += size;

	m->next = hdr->tag_encoding_map[CRAM_MAP(key[0],key[1])];
	hdr->tag_encoding_map[CRAM_MAP(key[0],key[1])] = m;
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    return hdr;
}